

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int lws_http_to_fallback(lws *wsi,uchar *obuf,size_t olen)

{
  byte bVar1;
  short sVar2;
  lws_callback_reasons lVar3;
  lws_protocols *plVar4;
  int iVar5;
  uint uVar6;
  lws_role_ops *plVar7;
  lws_protocols *plVar8;
  short sVar9;
  lws_callback_reasons lVar10;
  lws_vhost *vh;
  lws_protocols *p;
  lws_role_ops *ops;
  char ipbuf [64];
  
  vh = wsi->vhost;
  bVar1 = vh->raw_protocol_index;
  plVar4 = vh->protocols;
  ops = &role_ops_raw_skt;
  if (vh->listen_accept_role != (char *)0x0) {
    plVar7 = lws_role_by_name(vh->listen_accept_role);
    vh = wsi->vhost;
    if (plVar7 != (lws_role_ops *)0x0) {
      ops = lws_role_by_name(vh->listen_accept_role);
      vh = wsi->vhost;
    }
  }
  p = plVar4 + bVar1;
  if (vh->listen_accept_protocol != (char *)0x0) {
    plVar8 = lws_vhost_name_to_protocol(vh,vh->listen_accept_protocol);
    if (plVar8 != (lws_protocols *)0x0) {
      p = plVar8;
    }
  }
  lws_bind_protocol(wsi,p,"lws_http_to_fallback");
  lws_role_transition(wsi,0x20000000,LRS_ESTABLISHED,ops);
  lws_header_table_detach(wsi,0);
  lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
  lVar3 = *(lws_callback_reasons *)wsi->role_ops->adoption_cb;
  lVar10 = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
  if ((short)lVar3 != 0) {
    lVar10 = lVar3;
  }
  ipbuf[0] = '\0';
  lws_get_peer_simple(wsi,ipbuf,0x40);
  _lws_log(4,"%s: vh %s, peer: %s, role %s, protocol %s, cb %d, ah %p\n","lws_http_to_fallback",
           wsi->vhost->name,ipbuf,ops->name,p->name,(ulong)(lVar10 & 0xffff),(wsi->http).ah);
  iVar5 = (*wsi->protocol->callback)(wsi,lVar10 & 0xffff,wsi->user_space,(void *)0x0,0);
  uVar6 = 1;
  if (iVar5 == 0) {
    sVar2 = *(short *)((long)wsi->role_ops->rx_cb + (ulong)(wsi->wsistate >> 0x1c & 2));
    sVar9 = 0x3b;
    if (sVar2 != 0) {
      sVar9 = sVar2;
    }
    iVar5 = (*wsi->protocol->callback)(wsi,(lws_callback_reasons)sVar9,wsi->user_space,obuf,olen);
    uVar6 = (uint)(iVar5 != 0);
  }
  return uVar6;
}

Assistant:

int
lws_http_to_fallback(struct lws *wsi, unsigned char *obuf, size_t olen)
{
	const struct lws_role_ops *role = &role_ops_raw_skt;
	const struct lws_protocols *p1, *protocol =
			 &wsi->vhost->protocols[wsi->vhost->raw_protocol_index];
	char ipbuf[64];
	int n;

	if (wsi->vhost->listen_accept_role &&
	    lws_role_by_name(wsi->vhost->listen_accept_role))
		role = lws_role_by_name(wsi->vhost->listen_accept_role);

	if (wsi->vhost->listen_accept_protocol) {
		p1 = lws_vhost_name_to_protocol(wsi->vhost,
			    wsi->vhost->listen_accept_protocol);
		if (p1)
			protocol = p1;
	}

	lws_bind_protocol(wsi, protocol, __func__);

	lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED, role);

	lws_header_table_detach(wsi, 0);
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (wsi->role_ops->adoption_cb[0])
		n = wsi->role_ops->adoption_cb[0];

	ipbuf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
	lws_get_peer_simple(wsi, ipbuf, sizeof(ipbuf));
#endif

	lwsl_notice("%s: vh %s, peer: %s, role %s, "
		    "protocol %s, cb %d, ah %p\n", __func__, wsi->vhost->name,
		    ipbuf, role->name, protocol->name, n, wsi->http.ah);

	if ((wsi->protocol->callback)(wsi, n, wsi->user_space, NULL, 0))
		return 1;

	n = LWS_CALLBACK_RAW_RX;
	if (wsi->role_ops->rx_cb[lwsi_role_server(wsi)])
		n = wsi->role_ops->rx_cb[lwsi_role_server(wsi)];
	if (wsi->protocol->callback(wsi, n, wsi->user_space, obuf, olen))
		return 1;

	return 0;
}